

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSet::AlterOwnership
          (CatalogSet *this,CatalogTransaction transaction,ChangeOwnershipInfo *info)

{
  CatalogType type;
  DuckCatalog *pDVar1;
  pointer pCVar2;
  pointer pCVar3;
  int iVar4;
  optional_ptr<duckdb::CatalogEntry,_true> oVar5;
  undefined4 extraout_var;
  SchemaCatalogEntry *this_00;
  undefined4 extraout_var_00;
  DependencyManager *this_01;
  CatalogEntry *owner;
  CatalogEntry *entry_00;
  CatalogException *this_02;
  CatalogType *pCVar6;
  initializer_list<duckdb::CatalogType> __l;
  allocator_type local_129;
  vector<duckdb::CatalogType,_true> entry_types;
  optional_ptr<duckdb::CatalogEntry,_true> owner_entry;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> schema;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  unique_lock<std::mutex> write_lock;
  EntryLookupInfo local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::unique_lock<std::mutex>::unique_lock(&write_lock,&this->catalog->write_lock);
  oVar5 = GetEntryInternal(this,transaction,&(info->super_AlterInfo).name);
  entry = oVar5;
  if (oVar5.ptr == (CatalogEntry *)0x0) {
LAB_0160850d:
    ::std::unique_lock<std::mutex>::~unique_lock(&write_lock);
    return oVar5.ptr != (CatalogEntry *)0x0;
  }
  owner_entry.ptr = (CatalogEntry *)0x0;
  pDVar1 = this->catalog;
  entry_types.super_vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>.
  super__Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)transaction.transaction.ptr;
  entry_types.super_vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>.
  super__Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)transaction.db.ptr;
  entry_types.super_vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>.
  super__Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)transaction.context.ptr;
  EntryLookupInfo::EntryLookupInfo
            (&local_90,SCHEMA_ENTRY,&info->owner_schema,(QueryErrorContext)0xffffffffffffffff);
  iVar4 = (*(pDVar1->super_Catalog)._vptr_Catalog[8])(pDVar1,&local_90,1);
  schema.ptr = (SchemaCatalogEntry *)CONCAT44(extraout_var,iVar4);
  if (schema.ptr != (SchemaCatalogEntry *)0x0) {
    local_90.catalog_type = TABLE_ENTRY;
    local_90._1_1_ = 6;
    __l._M_len = 2;
    __l._M_array = &local_90.catalog_type;
    ::std::vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>::vector
              (&entry_types.super_vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>,
               __l,&local_129);
    pCVar2 = entry_types.super_vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>.
             super__Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar3 = entry_types.super_vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>.
             super__Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pCVar6 = pCVar3;
      if (pCVar6 == pCVar2) {
        ::std::_Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>::
        ~_Vector_base((_Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_> *)
                      &entry_types);
        goto LAB_01608543;
      }
      type = *pCVar6;
      this_00 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->(&schema);
      owner_entry = SchemaCatalogEntry::GetEntry(this_00,transaction,type,&info->owner_name);
      pCVar3 = pCVar6 + 1;
    } while (owner_entry.ptr == (CatalogEntry *)0x0);
    ::std::_Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>::~_Vector_base
              ((_Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_> *)
               &entry_types);
    if (pCVar6 != pCVar2) {
      ::std::unique_lock<std::mutex>::unlock(&write_lock);
      iVar4 = (*(this->catalog->super_Catalog)._vptr_Catalog[0x1a])();
      entry_types.super_vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>.
      super__Vector_base<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar4);
      this_01 = optional_ptr<duckdb::DependencyManager,_true>::operator->
                          ((optional_ptr<duckdb::DependencyManager,_true> *)&entry_types);
      owner = optional_ptr<duckdb::CatalogEntry,_true>::operator*(&owner_entry);
      entry_00 = optional_ptr<duckdb::CatalogEntry,_true>::operator*(&entry);
      DependencyManager::AddOwnership(this_01,transaction,owner,entry_00);
      goto LAB_0160850d;
    }
  }
LAB_01608543:
  this_02 = (CatalogException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&entry_types,"CatalogElement \"%s.%s\" does not exist!",
             (allocator *)&local_90);
  ::std::__cxx11::string::string((string *)&local_50,(string *)&info->owner_schema);
  ::std::__cxx11::string::string((string *)&local_70,(string *)&info->owner_name);
  CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
            (this_02,(string *)&entry_types,&local_50,&local_70);
  __cxa_throw(this_02,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool CatalogSet::AlterOwnership(CatalogTransaction transaction, ChangeOwnershipInfo &info) {
	// lock the catalog for writing
	unique_lock<mutex> write_lock(catalog.GetWriteLock());

	auto entry = GetEntryInternal(transaction, info.name);
	if (!entry) {
		return false;
	}
	optional_ptr<CatalogEntry> owner_entry;
	auto schema = catalog.GetSchema(transaction, info.owner_schema, OnEntryNotFound::RETURN_NULL);
	if (schema) {
		vector<CatalogType> entry_types {CatalogType::TABLE_ENTRY, CatalogType::SEQUENCE_ENTRY};
		for (auto entry_type : entry_types) {
			owner_entry = schema->GetEntry(transaction, entry_type, info.owner_name);
			if (owner_entry) {
				break;
			}
		}
	}
	if (!owner_entry) {
		throw CatalogException("CatalogElement \"%s.%s\" does not exist!", info.owner_schema, info.owner_name);
	}
	write_lock.unlock();
	catalog.GetDependencyManager()->AddOwnership(transaction, *owner_entry, *entry);
	return true;
}